

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runner.h
# Opt level: O3

void AssertEqual<bool,bool>(bool *t,bool *u,string *hint)

{
  ostream *poVar1;
  runtime_error *this;
  ostringstream os;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  if (*t == *u) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Assertion failed: ",0x12)
  ;
  poVar1 = std::ostream::_M_insert<bool>(SUB81(local_1a0,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," != ",4);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," hint: ",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(hint->_M_dataplus)._M_p,hint->_M_string_length);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1c0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AssertEqual(const T& t, const U& u,
                 const string& hint)
{
    if (t != u) {
        ostringstream os;
        os << "Assertion failed: " << t << " != " << u
           << " hint: " << hint;
        throw runtime_error(os.str());
    }
}